

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jinx.hpp
# Opt level: O2

void __thiscall Jinx::Impl::Parser::ParseExpression(Parser *this,SymbolListCItr endSymbol)

{
  Opcode opcode;
  bool bVar1;
  SymbolListCItr SVar2;
  uint32_t count;
  uint32_t val;
  
  bVar1 = Accept(this,SquareOpen);
  if (bVar1) {
    bVar1 = Accept(this,SquareClose);
    if (bVar1) {
      EmitOpcode(this,PushColl);
      val = 0;
      goto LAB_001d0261;
    }
    ParseSubexpression(this,endSymbol);
    bVar1 = Accept(this,Comma);
    if (!bVar1) {
      Error<>(this,"Expected comma separating key-value pair");
      return;
    }
    ParseExpression(this,endSymbol);
    Expect(this,SquareClose,(char *)0x0);
    val = 1;
    while( true ) {
      bVar1 = Accept(this,Comma);
      if (!bVar1) break;
      Accept(this,NewLine);
      Expect(this,SquareOpen,(char *)0x0);
      ParseSubexpression(this,endSymbol);
      Expect(this,Comma,(char *)0x0);
      ParseSubexpression(this,endSymbol);
      Expect(this,SquareClose,(char *)0x0);
      val = val + 1;
    }
    opcode = PushColl;
  }
  else {
    SVar2 = GetNextSymbolOfType(this,Comma,endSymbol);
    ParseSubexpression(this,SVar2);
    bVar1 = Accept(this,Comma);
    if (!bVar1) {
      return;
    }
    val = 1;
    do {
      Accept(this,NewLine);
      SVar2 = GetNextSymbolOfType(this,Comma,endSymbol);
      ParseSubexpression(this,SVar2);
      val = val + 1;
      bVar1 = Accept(this,Comma);
    } while (bVar1);
    opcode = PushList;
  }
  EmitOpcode(this,opcode);
LAB_001d0261:
  BinaryWriter::Write(&this->m_writer,val);
  return;
}

Assistant:

inline void Parser::ParseExpression(SymbolListCItr endSymbol)
	{
		// Check first for an opening bracket, which indicates either an index operator or a key-value pair.
		if (Accept(SymbolType::SquareOpen))
		{
			if (Accept(SymbolType::SquareClose))
			{
				// If we immediately see a close bracket, create an empty collection
				EmitOpcode(Opcode::PushColl);
				EmitCount(0);
			}
			else
			{
				ParseSubexpression(endSymbol);

				// If we see a comma after a square open bracket, we're parsing a key-value pair
				if (Accept(SymbolType::Comma))
				{
					ParseExpression(endSymbol);
					Expect(SymbolType::SquareClose);

					// Parse all subsequent key-value pairs
					uint32_t count = 1;
					while (Accept(SymbolType::Comma))
					{
						Accept(SymbolType::NewLine);
						Expect(SymbolType::SquareOpen);
						ParseSubexpression(endSymbol);
						Expect(SymbolType::Comma);
						ParseSubexpression(endSymbol);
						Expect(SymbolType::SquareClose);
						++count;
					}

					// Pop all key-value pairs and push a new collection onto the stack
					EmitOpcode(Opcode::PushColl);
					EmitCount(count);
				}
				else
				{
					Error("Expected comma separating key-value pair");
				}
			}
		}
		else
		{
			// Advance only to first comma
			auto localEndSymbol = GetNextSymbolOfType(SymbolType::Comma, endSymbol);

			// Parse the first subexpression, defined as any normal expression excluding index operators or lists, 
			// which are handled in this function
			ParseSubexpression(localEndSymbol);

			// If we finish the first subexpression with a common, then we're parsing an indexed list
			if (Accept(SymbolType::Comma))
			{
				// Parse all subexpressions in comma-delimited list
				uint32_t count = 1;
				do
				{
					Accept(SymbolType::NewLine);
					localEndSymbol = GetNextSymbolOfType(SymbolType::Comma, endSymbol);
					ParseSubexpression(localEndSymbol);
					++count;
				} 
				while (Accept(SymbolType::Comma));

				// Pop all key-value pairs and push the results on the stack
				EmitOpcode(Opcode::PushList);
				EmitCount(count);
			}
		}
	}